

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_object_detector.c
# Opt level: O0

int is_mach_o_magic(elf_header *h,uint *endian,uint *offsetsize)

{
  unsigned_long uVar1;
  uint local_38;
  uint local_34;
  uint locoffsetsize;
  uint locendian;
  unsigned_long magicval;
  uint *offsetsize_local;
  uint *endian_local;
  elf_header *h_local;
  
  uVar1 = magic_copy(h->e_ident,4);
  if (uVar1 == 0xfeedface) {
    local_34 = 1;
    local_38 = 0x20;
  }
  else if (uVar1 == 0xcefaedfe) {
    local_34 = 2;
    local_38 = 0x20;
  }
  else {
    if (uVar1 == 0xfeedfacf) {
      local_34 = 1;
    }
    else {
      if (uVar1 != 0xcffaedfe) {
        return 0;
      }
      local_34 = 2;
    }
    local_38 = 0x40;
  }
  *endian = local_34;
  *offsetsize = local_38;
  return 1;
}

Assistant:

static int
is_mach_o_magic(struct elf_header *h,
    unsigned *endian,
    unsigned *offsetsize)
{
    unsigned long magicval = 0;
    unsigned locendian = 0;
    unsigned locoffsetsize = 0;

    /*  No swapping here. Need to match size of
        Mach-o magic field. */
    magicval = magic_copy(h->e_ident,4);
    if (magicval == MH_MAGIC) {
        locendian = DW_END_big;
        locoffsetsize = 32;
    } else if (magicval == MH_CIGAM) {
        locendian = DW_END_little;
        locoffsetsize = 32;
    }else if (magicval == MH_MAGIC_64) {
        locendian = DW_END_big;
        locoffsetsize = 64;
    } else if (magicval == MH_CIGAM_64) {
        locendian = DW_END_little;
        locoffsetsize = 64;
    } else {
        return FALSE;
    }
    *endian = locendian;
    *offsetsize = locoffsetsize;
    return TRUE;
}